

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_disconnect(connectdata *conn,_Bool dead_connection)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  undefined7 in_register_00000031;
  
  if ((((int)CONCAT71(in_register_00000031,dead_connection) == 0) &&
      (pcVar1 = (conn->proto).ftpc.pp.conn, pcVar1 != (connectdata *)0x0)) &&
     ((pcVar1->bits).protoconnstart == true)) {
    CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","QUIT");
    if (CVar2 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_APPEND_FINAL;
      smtp_block_statemach(conn);
    }
  }
  Curl_pp_disconnect(&(conn->proto).ftpc.pp);
  Curl_sasl_cleanup(conn,*(uint *)((long)&conn->proto + 0x94));
  (*Curl_cfree)((conn->proto).ftpc.dirs);
  (conn->proto).ftpc.dirs = (char **)0x0;
  return CURLE_OK;
}

Assistant:

static CURLcode smtp_disconnect(struct connectdata *conn, bool dead_connection)
{
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to. */

  /* The SMTP session may or may not have been allocated/setup at this
     point! */
  if(!dead_connection && smtpc->pp.conn && smtpc->pp.conn->bits.protoconnstart)
    if(!smtp_perform_quit(conn))
      (void)smtp_block_statemach(conn); /* ignore errors on QUIT */

  /* Disconnect from the server */
  Curl_pp_disconnect(&smtpc->pp);

  /* Cleanup the SASL module */
  Curl_sasl_cleanup(conn, smtpc->sasl.authused);

  /* Cleanup our connection based variables */
  Curl_safefree(smtpc->domain);

  return CURLE_OK;
}